

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O0

ostream * Kernel::operator<<(ostream *out,Symbol *self)

{
  string *psVar1;
  ostream *poVar2;
  Symbol *in_RSI;
  ostream *in_RDI;
  OperatorType *in_stack_00000028;
  ostream *in_stack_00000030;
  
  psVar1 = Signature::Symbol::name_abi_cxx11_(in_RSI);
  poVar2 = std::operator<<(in_RDI,(string *)psVar1);
  std::operator<<(poVar2,": ");
  if (in_RSI->_type == (OperatorType *)0x0) {
    std::operator<<(in_RDI,"<type not (yet) set>");
  }
  else {
    operator<<(in_stack_00000030,in_stack_00000028);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Signature::Symbol& self)
    { 
      out << self.name() << ": "; 
      if (self._type) {
        out << *self._type;
      } else {
        out << "<type not (yet) set>";
      }
      return out;
    }